

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

String * __thiscall
capnp::compiler::ValueTranslator::makeTypeName
          (String *__return_storage_ptr__,ValueTranslator *this,Type type)

{
  size_t sVar1;
  Which WVar2;
  Schema schema;
  char (*params) [11];
  char *pcVar3;
  char (*in_R8) [2];
  Type type_00;
  undefined8 local_48;
  anon_union_8_2_eba6ea51_for_Type_5 local_40;
  String local_38;
  
  local_40 = type.field_4;
  params = type._0_8_;
  local_48._2_1_ = type.listDepth;
  WVar2 = LIST;
  if (local_48._2_1_ == '\0') {
    WVar2 = type.baseType;
  }
  local_48 = params;
  switch(WVar2) {
  case VOID:
    pcVar3 = "Void";
    break;
  case BOOL:
    pcVar3 = "Bool";
    break;
  case INT8:
    pcVar3 = "Int8";
    break;
  case INT16:
    pcVar3 = "Int16";
    goto LAB_003e3625;
  case INT32:
    pcVar3 = "Int32";
    goto LAB_003e3625;
  case INT64:
    pcVar3 = "Int64";
    goto LAB_003e3625;
  case UINT8:
    pcVar3 = "UInt8";
LAB_003e3625:
    kj::str<char_const(&)[6]>(__return_storage_ptr__,(kj *)pcVar3,(char (*) [6])params);
    return __return_storage_ptr__;
  case UINT16:
    pcVar3 = "UInt16";
    goto LAB_003e3658;
  case UINT32:
    pcVar3 = "UInt32";
    goto LAB_003e3658;
  case UINT64:
    pcVar3 = "UInt64";
LAB_003e3658:
    kj::str<char_const(&)[7]>(__return_storage_ptr__,(kj *)pcVar3,(char (*) [7])params);
    return __return_storage_ptr__;
  case FLOAT32:
    pcVar3 = "Float32";
    goto LAB_003e3647;
  case FLOAT64:
    pcVar3 = "Float64";
LAB_003e3647:
    kj::str<char_const(&)[8]>(__return_storage_ptr__,(kj *)pcVar3,(char (*) [8])params);
    return __return_storage_ptr__;
  case TEXT:
    pcVar3 = "Text";
    break;
  case DATA:
    pcVar3 = "Data";
    break;
  case LIST:
    type_00 = (Type)Type::asList((Type *)&local_48);
    makeTypeName(&local_38,this,type_00);
    kj::str<char_const(&)[6],kj::String,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)"List(",(char (*) [6])&local_38,(String *)0x52a047,in_R8
              );
    sVar1 = local_38.content.size_;
    pcVar3 = local_38.content.ptr;
    if (local_38.content.ptr == (char *)0x0) {
      return __return_storage_ptr__;
    }
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar3,1,sVar1,sVar1,0);
    return __return_storage_ptr__;
  case ENUM:
    schema.raw = (RawBrandedSchema *)Type::asEnum((Type *)&local_48);
    goto LAB_003e35f7;
  case STRUCT:
    schema.raw = (RawBrandedSchema *)Type::asStruct((Type *)&local_48);
    goto LAB_003e35f7;
  case INTERFACE:
    schema.raw = (RawBrandedSchema *)Type::asInterface((Type *)&local_48);
LAB_003e35f7:
    makeNodeName(__return_storage_ptr__,this,schema);
    return __return_storage_ptr__;
  case ANY_POINTER:
    kj::str<char_const(&)[11]>(__return_storage_ptr__,(kj *)0x59aa22,params);
    return __return_storage_ptr__;
  default:
    kj::_::unreachable();
  }
  kj::str<char_const(&)[5]>(__return_storage_ptr__,(kj *)pcVar3,(char (*) [5])params);
  return __return_storage_ptr__;
}

Assistant:

kj::String ValueTranslator::makeTypeName(Type type) {
  switch (type.which()) {
    case schema::Type::VOID: return kj::str("Void");
    case schema::Type::BOOL: return kj::str("Bool");
    case schema::Type::INT8: return kj::str("Int8");
    case schema::Type::INT16: return kj::str("Int16");
    case schema::Type::INT32: return kj::str("Int32");
    case schema::Type::INT64: return kj::str("Int64");
    case schema::Type::UINT8: return kj::str("UInt8");
    case schema::Type::UINT16: return kj::str("UInt16");
    case schema::Type::UINT32: return kj::str("UInt32");
    case schema::Type::UINT64: return kj::str("UInt64");
    case schema::Type::FLOAT32: return kj::str("Float32");
    case schema::Type::FLOAT64: return kj::str("Float64");
    case schema::Type::TEXT: return kj::str("Text");
    case schema::Type::DATA: return kj::str("Data");
    case schema::Type::LIST:
      return kj::str("List(", makeTypeName(type.asList().getElementType()), ")");
    case schema::Type::ENUM: return makeNodeName(type.asEnum());
    case schema::Type::STRUCT: return makeNodeName(type.asStruct());
    case schema::Type::INTERFACE: return makeNodeName(type.asInterface());
    case schema::Type::ANY_POINTER: return kj::str("AnyPointer");
  }
  KJ_UNREACHABLE;
}